

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::dotR(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint uVar2;
  Cell CVar3;
  ostream *poVar4;
  
  requireDStackDepth(this,2,".R");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  if (this->writeToTarget == ToStdCout) {
    CVar3 = getNumericBase(this);
    poVar4 = std::operator<<(&std::cout,CVar3);
    *(long *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = (long)(int)uVar1;
    std::ostream::operator<<(poVar4,uVar2);
    std::ostream::flush();
    return;
  }
  if (this->writeToTarget == ToString) {
    CVar3 = getNumericBase(this);
    poVar4 = std::operator<<(&this->field_0x20,CVar3);
    *(long *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = (long)(int)uVar1;
    std::ostream::operator<<(poVar4,uVar2);
    return;
  }
  return;
}

Assistant:

void dotR() {
			REQUIRE_DSTACK_DEPTH(2, ".R");
			auto width = static_cast<int>(dStack.getTop()); pop();
			auto n = static_cast<SCell>(dStack.getTop()); pop();
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			switch (writeToTarget) {
			case ToString:
				std_cout << SETBASE() << std::setw(width) << n;
				break;
			case ToStdCout:
				std::cout << SETBASE() << std::setw(width) << n;
				std::cout.flush();
				break;
			default:
				break;
			}
#endif
		}